

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TransformFeedbackHandler<tcu::Vector<float,_3>_>::
TransformFeedbackHandler
          (TransformFeedbackHandler<tcu::Vector<float,_3>_> *this,RenderContext *renderCtx,
          int maxNumVertices)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  int bufferSize;
  Functions *gl;
  int maxNumVertices_local;
  RenderContext *renderCtx_local;
  TransformFeedbackHandler<tcu::Vector<float,_3>_> *this_local;
  
  this->m_renderCtx = renderCtx;
  glu::TypedObjectWrapper<(glu::ObjectType)4>::TypedObjectWrapper(&this->m_tf,renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper(&this->m_tfBuffer,renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)6>::TypedObjectWrapper(&this->m_tfPrimQuery,renderCtx);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x40);
  dVar3 = glu::ObjectWrapper::operator*(&(this->m_tfBuffer).super_ObjectWrapper);
  (*pcVar1)(0x8c8e,dVar3);
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x150))
            (0x8c8e,(long)(maxNumVertices * 0xc + 0x24),0,0x88e9);
  return;
}

Assistant:

TransformFeedbackHandler<AttribType>::TransformFeedbackHandler (const glu::RenderContext& renderCtx, int maxNumVertices)
	: m_renderCtx		(renderCtx)
	, m_tf				(renderCtx)
	, m_tfBuffer		(renderCtx)
	, m_tfPrimQuery		(renderCtx)
{
	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	// \note Room for 1 extra triangle, to detect if GL returns too many primitives.
	const int				bufferSize	= (maxNumVertices + 3) * (int)sizeof(AttribType);

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, *m_tfBuffer);
	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_READ);
}